

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmGates.c
# Opt level: O1

Abc_Ntk_t * Mpm_ManDeriveMappedAbcNtk(Mpm_Man_t *p,Mio_Library_t *pMio)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  int *piVar4;
  Mmr_Step_t *pMVar5;
  long lVar6;
  Vec_Int_t *pVVar7;
  int iVar8;
  uint uVar9;
  Vec_Ptr_t *__ptr;
  Vec_Int_t *vCopy;
  int *__s;
  Vec_Int_t *__ptr_00;
  Abc_Ntk_t *pNtk;
  char *pcVar10;
  Abc_Obj_t *pAVar11;
  Abc_Obj_t *pAVar12;
  Mig_Man_t *pMVar13;
  byte bVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  
  __ptr = Mpm_ManFindCells(pMio,(SC_Lib *)p->pPars->pScl,p->vNpnConfigs);
  if (__ptr == (Vec_Ptr_t *)0x0) {
    puts("Genlib library does not match SCL library.");
    pNtk = (Abc_Ntk_t *)0x0;
  }
  else {
    iVar1 = p->pMig->nObjs;
    iVar8 = iVar1 * 2;
    vCopy = (Vec_Int_t *)malloc(0x10);
    iVar15 = 0x10;
    if (0xe < iVar8 - 1U) {
      iVar15 = iVar8;
    }
    vCopy->nSize = 0;
    vCopy->nCap = iVar15;
    if (iVar15 == 0) {
      __s = (int *)0x0;
    }
    else {
      __s = (int *)malloc((long)iVar15 << 2);
    }
    vCopy->pArray = __s;
    vCopy->nSize = iVar8;
    if (__s != (int *)0x0) {
      memset(__s,0xff,(long)iVar1 << 3);
    }
    __ptr_00 = Mpm_ManFindMappedNodes(p);
    pNtk = Abc_NtkAlloc(ABC_NTK_LOGIC,ABC_FUNC_MAP,1);
    pcVar10 = Extra_UtilStrsav(p->pMig->pName);
    pNtk->pName = pcVar10;
    pNtk->pManFunc = pMio;
    pMVar13 = p->pMig;
    if (0 < (pMVar13->vCis).nSize) {
      lVar20 = 0;
      do {
        if ((pMVar13->vCis).nSize <= lVar20) goto LAB_00479a8d;
        uVar16 = (pMVar13->vCis).pArray[lVar20];
        if (((int)uVar16 < 0) || (pMVar13->nObjs <= (int)uVar16)) goto LAB_00479a4f;
        if ((pMVar13->vPages).nSize <= (int)(uVar16 >> 0xc)) goto LAB_00479a6e;
        pvVar3 = (pMVar13->vPages).pArray[uVar16 >> 0xc];
        if (pvVar3 == (void *)0x0) break;
        pAVar11 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PI);
        uVar16 = *(uint *)((long)pvVar3 + (ulong)((uVar16 & 0xfff) << 4) + 0xc);
        if (((int)uVar16 < 0) || (uVar16 = uVar16 & 0xfffffffe, iVar8 <= (int)uVar16))
        goto LAB_00479acb;
        __s[uVar16] = pAVar11->Id;
        lVar20 = lVar20 + 1;
        pMVar13 = p->pMig;
      } while (lVar20 < (pMVar13->vCis).nSize);
    }
    Abc_NtkAddDummyPiNames(pNtk);
    pMVar13 = p->pMig;
    uVar17 = (ulong)(pMVar13->vCos).nSize;
    if (0 < (long)uVar17) {
      uVar16 = (pMVar13->vCos).nSize;
      uVar21 = 0;
      uVar19 = (ulong)uVar16;
      if ((int)uVar16 < 1) {
        uVar19 = uVar21;
      }
      do {
        if (uVar19 == uVar21) goto LAB_00479a8d;
        uVar16 = (pMVar13->vCos).pArray[uVar21];
        if (((int)uVar16 < 0) || (pMVar13->nObjs <= (int)uVar16)) goto LAB_00479a4f;
        if ((pMVar13->vPages).nSize <= (int)(uVar16 >> 0xc)) goto LAB_00479a6e;
        pvVar3 = (pMVar13->vPages).pArray[uVar16 >> 0xc];
        if (pvVar3 == (void *)0x0) break;
        if (*(int *)((long)pvVar3 + (ulong)((uVar16 & 0xfff) << 4)) == 0) {
          pAVar11 = Abc_NtkCreateNodeConst0(pNtk);
          if (iVar1 < 1) goto LAB_00479acb;
          *__s = pAVar11->Id;
          break;
        }
        uVar21 = uVar21 + 1;
      } while (uVar17 != uVar21);
    }
    pMVar13 = p->pMig;
    uVar17 = (ulong)(pMVar13->vCos).nSize;
    if (0 < (long)uVar17) {
      uVar16 = (pMVar13->vCos).nSize;
      uVar21 = 0;
      uVar19 = (ulong)uVar16;
      if ((int)uVar16 < 1) {
        uVar19 = uVar21;
      }
      do {
        if (uVar19 == uVar21) goto LAB_00479a8d;
        uVar16 = (pMVar13->vCos).pArray[uVar21];
        if (((int)uVar16 < 0) || (pMVar13->nObjs <= (int)uVar16)) goto LAB_00479a4f;
        if ((pMVar13->vPages).nSize <= (int)(uVar16 >> 0xc)) goto LAB_00479a6e;
        pvVar3 = (pMVar13->vPages).pArray[uVar16 >> 0xc];
        if (pvVar3 == (void *)0x0) break;
        if (*(int *)((long)pvVar3 + (ulong)((uVar16 & 0xfff) << 4)) == 1) {
          pAVar11 = Abc_NtkCreateNodeConst1(pNtk);
          if (iVar1 < 1) goto LAB_00479acb;
          __s[1] = pAVar11->Id;
          break;
        }
        uVar21 = uVar21 + 1;
      } while (uVar17 != uVar21);
    }
    iVar1 = __ptr_00->nSize;
    if (0 < (long)iVar1) {
      piVar4 = __ptr_00->pArray;
      lVar20 = 0;
      do {
        uVar16 = piVar4[lVar20];
        if (((int)uVar16 < 0) || (pMVar13 = p->pMig, pMVar13->nObjs <= (int)uVar16))
        goto LAB_00479a4f;
        if ((pMVar13->vPages).nSize <= (int)(uVar16 >> 0xc)) goto LAB_00479a6e;
        uVar9 = *(uint *)((long)(pMVar13->vPages).pArray[uVar16 >> 0xc] +
                         (ulong)((uVar16 & 0xfff) << 4) + 0xc) >> 1;
        if ((p->vCutBests).nSize <= (int)uVar9) goto LAB_00479a8d;
        uVar9 = (p->vCutBests).pArray[uVar9];
        pMVar5 = p->pManCuts;
        uVar18 = pMVar5->uMask & uVar9;
        if ((int)uVar18 < 1) {
          __assert_fail("(h & p->uMask) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/mem/mem2.h"
                        ,0xee,"word *Mmr_StepEntry(Mmr_Step_t *, int)");
        }
        uVar9 = (int)uVar9 >> ((byte)pMVar5->nBits & 0x1f);
        if ((int)uVar9 < 1) {
LAB_00479aac:
          __assert_fail("h > 0 && h < (Vec_PtrSize(&p->vPages) << p->nPageBase)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/mem/mem2.h"
                        ,0xb2,"word *Mmr_FixedEntry(Mmr_Fixed_t *, int)");
        }
        iVar15 = *(int *)((long)pMVar5 + (ulong)uVar18 * 0x38 + 0x34);
        bVar14 = (byte)*(undefined4 *)((long)pMVar5 + (ulong)uVar18 * 0x38 + 0x18);
        if (iVar15 << (bVar14 & 0x1f) <= (int)uVar9) goto LAB_00479aac;
        bVar14 = bVar14 & 0x1f;
        uVar22 = uVar9 >> bVar14;
        if (((int)(uVar9 >> bVar14) < 0) || (iVar15 <= (int)uVar22)) goto LAB_00479a6e;
        lVar6 = *(long *)(*(long *)((long)pMVar5 + (ulong)uVar18 * 0x38 + 0x38) + (ulong)uVar22 * 8)
        ;
        uVar17 = (ulong)(uVar9 & *(uint *)((long)pMVar5 + (ulong)uVar18 * 0x38 + 0x1c));
        uVar9 = *(uint *)(lVar6 + 4 + uVar17 * 8);
        if ((uVar9 >> 0x19) + 0xc >> 3 != uVar18) {
          __assert_fail("Mpm_CutWordNum(pCut->nLeaves) == (h & p->pManCuts->uMask)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmInt.h"
                        ,0xaf,"Mpm_Cut_t *Mpm_CutFetch(Mpm_Man_t *, int)");
        }
        uVar9 = uVar9 >> 1 & 0xffffff;
        if (p->vNpnConfigs->nSize <= (int)uVar9) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        pVVar7 = p->vNpnConfigs->pArray;
        uVar19 = (ulong)(uVar9 << 4);
        if (*(int *)((long)&pVVar7->nSize + uVar19) < 1) goto LAB_00479a8d;
        lVar6 = lVar6 + uVar17 * 8;
        uVar9 = **(uint **)((long)&pVVar7->pArray + uVar19);
        pAVar11 = Abc_NtkCreateObj(pNtk,ABC_OBJ_NODE);
        uVar18 = *(uint *)(lVar6 + 4) >> 1 & 0xffffff;
        if (__ptr->nSize <= (int)uVar18) goto LAB_00479a6e;
        pvVar3 = __ptr->pArray[uVar18];
        (pAVar11->field_5).pData = pvVar3;
        if (pvVar3 == (void *)0x0) {
          __assert_fail("pObj->pData != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmGates.c"
                        ,0xe0,"Abc_Ntk_t *Mpm_ManDeriveMappedAbcNtk(Mpm_Man_t *, Mio_Library_t *)");
        }
        uVar18 = *(uint *)(lVar6 + 4);
        if (0x7ffffff < uVar18) {
          uVar22 = uVar9 & 0xffff;
          if (0xb3ff < uVar22) {
            __assert_fail("(Config >> 6) < 720",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmGates.c"
                          ,0xe5,"Abc_Ntk_t *Mpm_ManDeriveMappedAbcNtk(Mpm_Man_t *, Mio_Library_t *)"
                         );
          }
          uVar17 = 0;
          do {
            uVar2 = *(uint *)(lVar6 + 8 + (long)p->Perm6[uVar22 >> 6][uVar17] * 4);
            if ((int)uVar2 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x132,"int Abc_LitNotCond(int, int)");
            }
            pAVar12 = Mpm_ManGetAbcNode(pNtk,vCopy,
                                        uVar2 ^ (uVar22 >> ((uint)uVar17 & 0x1f) & 1) != 0);
            Abc_ObjAddFanin(pAVar11,pAVar12);
            uVar17 = uVar17 + 1;
          } while (uVar17 < *(uint *)(lVar6 + 4) >> 0x1b);
        }
        uVar16 = ((uVar18 >> 0x19 ^ uVar18 ^ uVar9 >> 0x10) & 1) + uVar16 * 2;
        if (iVar8 <= (int)uVar16) {
LAB_00479acb:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        __s[uVar16] = pAVar11->Id;
        lVar20 = lVar20 + 1;
      } while (lVar20 != iVar1);
    }
    pMVar13 = p->pMig;
    if (0 < (pMVar13->vCos).nSize) {
      lVar20 = 0;
      do {
        if ((pMVar13->vCos).nSize <= lVar20) {
LAB_00479a8d:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar16 = (pMVar13->vCos).pArray[lVar20];
        if (((int)uVar16 < 0) || (pMVar13->nObjs <= (int)uVar16)) {
LAB_00479a4f:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mpm/mpmMig.h"
                        ,0x74,"Mig_Obj_t *Mig_ManObj(Mig_Man_t *, int)");
        }
        if ((pMVar13->vPages).nSize <= (int)(uVar16 >> 0xc)) {
LAB_00479a6e:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar3 = (pMVar13->vPages).pArray[uVar16 >> 0xc];
        if (pvVar3 == (void *)0x0) break;
        pAVar11 = Abc_NtkCreateObj(pNtk,ABC_OBJ_PO);
        pAVar12 = Mpm_ManGetAbcNode(pNtk,vCopy,
                                    *(int *)((long)pvVar3 + (ulong)((uVar16 & 0xfff) << 4)));
        Abc_ObjAddFanin(pAVar11,pAVar12);
        lVar20 = lVar20 + 1;
        pMVar13 = p->pMig;
      } while (lVar20 < (pMVar13->vCos).nSize);
    }
    Abc_NtkAddDummyPoNames(pNtk);
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
      __ptr->pArray = (void **)0x0;
    }
    free(__ptr);
    if (__ptr_00->pArray != (int *)0x0) {
      free(__ptr_00->pArray);
      __ptr_00->pArray = (int *)0x0;
    }
    if (__ptr_00 != (Vec_Int_t *)0x0) {
      free(__ptr_00);
    }
    if (__s != (int *)0x0) {
      free(__s);
      vCopy->pArray = (int *)0x0;
    }
    free(vCopy);
  }
  return pNtk;
}

Assistant:

Abc_Ntk_t * Mpm_ManDeriveMappedAbcNtk( Mpm_Man_t * p, Mio_Library_t * pMio )
{
    Abc_Ntk_t * pNtk;
    Vec_Ptr_t * vNpnGatesMio;
    Vec_Int_t * vNodes, * vCopy, * vClass;
    Abc_Obj_t * pObj, * pFanin;
    Mig_Obj_t * pNode;
    Mpm_Cut_t * pCutBest;
    int i, k, iNode, iMigLit, fCompl, Config;

    // find mapping of SCL cells into MIO cells
    vNpnGatesMio = Mpm_ManFindCells( pMio, (SC_Lib *)p->pPars->pScl, p->vNpnConfigs );
    if ( vNpnGatesMio == NULL )
    {
        printf( "Genlib library does not match SCL library.\n" );
        return NULL;
    }

    // create mapping for each phase of each node
    vCopy = Vec_IntStartFull( 2 * Mig_ManObjNum(p->pMig) );

    // get internal nodes
    vNodes = Mpm_ManFindMappedNodes( p );

    // start the network
    pNtk = Abc_NtkAlloc( ABC_NTK_LOGIC, ABC_FUNC_MAP, 1 );
    pNtk->pName = Extra_UtilStrsav( p->pMig->pName );
    pNtk->pManFunc = pMio;

    // create primary inputs
    Mig_ManForEachCi( p->pMig, pNode, i )
    {
        pObj = Abc_NtkCreatePi(pNtk);
        Vec_IntWriteEntry( vCopy, Abc_Var2Lit( Mig_ObjId(pNode), 0 ), Abc_ObjId(pObj) );
    }
    Abc_NtkAddDummyPiNames( pNtk );

    // create constant nodes
    Mig_ManForEachCo( p->pMig, pNode, i )
        if ( Mig_ObjFaninLit(pNode, 0) == 0 )
        {
            pObj = Abc_NtkCreateNodeConst0(pNtk);
            Vec_IntWriteEntry( vCopy, Abc_Var2Lit( 0, 0 ), Abc_ObjId(pObj) );
            break;
        }
    Mig_ManForEachCo( p->pMig, pNode, i )
        if ( Mig_ObjFaninLit(pNode, 0) == 1 )
        {
            pObj = Abc_NtkCreateNodeConst1(pNtk);
            Vec_IntWriteEntry( vCopy, Abc_Var2Lit( 0, 1 ), Abc_ObjId(pObj) );
            break;
        }

    // create internal nodes
    Vec_IntForEachEntry( vNodes, iNode, i )
    {
        pCutBest = Mpm_ObjCutBestP( p, Mig_ManObj(p->pMig, iNode) );
        vClass = Vec_WecEntry( p->vNpnConfigs, Abc_Lit2Var(pCutBest->iFunc) );
        Config = Vec_IntEntry( vClass, 0 );
        pObj = Abc_NtkCreateNode( pNtk );
        pObj->pData = Vec_PtrEntry( vNpnGatesMio, Abc_Lit2Var(pCutBest->iFunc) );
        assert( pObj->pData != NULL );
        fCompl = pCutBest->fCompl ^ Abc_LitIsCompl(pCutBest->iFunc) ^ ((Config >> 16) & 1);
        Config &= 0xFFFF;
        for ( k = 0; k < (int)pCutBest->nLeaves; k++ )
        {
            assert( (Config >> 6) < 720 );
            iMigLit = pCutBest->pLeaves[ (int)(p->Perm6[Config >> 6][k]) ];
            pFanin = Mpm_ManGetAbcNode( pNtk, vCopy, Abc_LitNotCond(iMigLit, (Config >> k) & 1) );
            Abc_ObjAddFanin( pObj, pFanin );
        }
        Vec_IntWriteEntry( vCopy, Abc_Var2Lit(iNode, fCompl), Abc_ObjId(pObj) );
    }

    // create primary outputs
    Mig_ManForEachCo( p->pMig, pNode, i )
    {
        pObj = Abc_NtkCreatePo(pNtk);
        pFanin = Mpm_ManGetAbcNode( pNtk, vCopy, Mig_ObjFaninLit(pNode, 0) );
        Abc_ObjAddFanin( pObj, pFanin );
    }
    Abc_NtkAddDummyPoNames( pNtk );

    // clean up
    Vec_PtrFree( vNpnGatesMio );
    Vec_IntFree( vNodes );
    Vec_IntFree( vCopy );
    return pNtk;
}